

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O1

ostream * ASDCP::JP2K::operator<<(ostream *strm,PictureDescriptor *PDesc)

{
  ulong uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  ostream *poVar6;
  long *plVar7;
  ulong uVar8;
  char *__s;
  size_t sVar9;
  i32_t i;
  int iVar10;
  ui8_t *puVar11;
  i32_t b;
  uint uVar12;
  ulong uVar13;
  char tmp_buf [512];
  ui8_t local_238 [520];
  
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       AspectRatio: ",0x14);
  poVar6 = (ostream *)std::ostream::operator<<(strm,(PDesc->AspectRatio).Numerator);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
  plVar7 = (long *)std::ostream::operator<<(poVar6,(PDesc->AspectRatio).Denominator);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"          EditRate: ",0x14);
  poVar6 = (ostream *)std::ostream::operator<<(strm,(PDesc->EditRate).Numerator);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
  plVar7 = (long *)std::ostream::operator<<(poVar6,(PDesc->EditRate).Denominator);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"        SampleRate: ",0x14);
  poVar6 = (ostream *)std::ostream::operator<<(strm,(PDesc->SampleRate).Numerator);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
  plVar7 = (long *)std::ostream::operator<<(poVar6,(PDesc->SampleRate).Denominator);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       StoredWidth: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"      StoredHeight: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"             Rsize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"             Xsize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"             Ysize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"            XOsize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"            YOsize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"            XTsize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"            YTsize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"           XTOsize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"           YTOsize: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm," ContainerDuration: ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"-- JPEG 2000 Metadata --",0x18);
  cVar5 = (char)strm;
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"    ImageComponents:",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"  bits  h-sep v-sep",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if (PDesc->Csize != 0) {
    puVar11 = &PDesc->ImageComponents[0].YRsize;
    uVar13 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(strm,"  ",2);
      *(undefined8 *)(strm + *(long *)(*(long *)strm + -0x18) + 0x10) = 4;
      poVar6 = (ostream *)
               std::ostream::operator<<(strm,((ImageComponent_t *)(puVar11 + -2))->Ssize + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 5;
      local_238[0] = puVar11[-1];
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_238,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 5;
      local_238[0] = *puVar11;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_238,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (1 < uVar13) break;
      uVar13 = uVar13 + 1;
      puVar11 = puVar11 + 3;
    } while (uVar13 < PDesc->Csize);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"               Scod: ",0x15);
  plVar7 = (long *)std::ostream::operator<<(strm,(ushort)(PDesc->CodingStyleDefault).Scod);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"   ProgressionOrder: ",0x15);
  plVar7 = (long *)std::ostream::operator<<
                             (strm,(ushort)(PDesc->CodingStyleDefault).SGcod.ProgressionOrder);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"     NumberOfLayers: ",0x15);
  uVar2 = *(ushort *)(PDesc->CodingStyleDefault).SGcod.NumberOfLayers;
  plVar7 = (long *)std::ostream::operator<<(strm,uVar2 << 8 | uVar2 >> 8);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm," MultiCompTransform: ",0x15);
  plVar7 = (long *)std::ostream::operator<<
                             (strm,(ushort)(PDesc->CodingStyleDefault).SGcod.MultiCompTransform);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"DecompositionLevels: ",0x15);
  plVar7 = (long *)std::ostream::operator<<
                             (strm,(ushort)(PDesc->CodingStyleDefault).SPcod.DecompositionLevels);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"     CodeblockWidth: ",0x15);
  plVar7 = (long *)std::ostream::operator<<
                             (strm,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockWidth);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"    CodeblockHeight: ",0x15);
  plVar7 = (long *)std::ostream::operator<<
                             (strm,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockHeight);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"     CodeblockStyle: ",0x15);
  plVar7 = (long *)std::ostream::operator<<
                             (strm,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockStyle);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"     Transformation: ",0x15);
  plVar7 = (long *)std::ostream::operator<<
                             (strm,(ushort)(PDesc->CodingStyleDefault).SPcod.Transformation);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  if ((PDesc->CodingStyleDefault).SPcod.PrecinctSize[0] == '\0') {
    uVar13 = 0;
  }
  else {
    uVar8 = 0;
    do {
      uVar13 = uVar8 + 1;
      if (0x1e < uVar8) break;
      lVar3 = uVar8 + 1;
      uVar8 = uVar13;
    } while ((PDesc->CodingStyleDefault).SPcod.PrecinctSize[lVar3] != '\0');
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"          Precincts: ",0x15);
  plVar7 = (long *)std::ostream::operator<<(strm,(short)uVar13);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"precinct dimensions:",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if ((int)uVar13 != 0) {
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(strm,"    ",4);
      uVar1 = uVar8 + 1;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,s_exp_lookup
                                 [(PDesc->CodingStyleDefault).SPcod.PrecinctSize[uVar8] & 0xf]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," x ",3);
      plVar7 = (long *)std::ostream::operator<<
                                 (poVar6,s_exp_lookup
                                         [(PDesc->CodingStyleDefault).SPcod.PrecinctSize[uVar8] >> 4
                                         ]);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      uVar8 = uVar1;
    } while ((uVar13 & 0xffffffff) != uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"               Sqcd: ",0x15);
  plVar7 = (long *)std::ostream::operator<<(strm,(ushort)(PDesc->QuantizationDefault).Sqcd);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"              SPqcd: ",0x15);
  __s = (char *)Kumu::bin2hex((PDesc->QuantizationDefault).SPqcd,
                              (uint)(PDesc->QuantizationDefault).SPqcdLength,(char *)local_238,0x200
                             );
  if (__s == (char *)0x0) {
    std::ios::clear((int)strm + (int)*(undefined8 *)(*(long *)strm + -0x18));
  }
  else {
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(strm,__s,sVar9);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if ((PDesc->Profile).N != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(strm,"Profile:",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    if ((PDesc->Profile).N != 0) {
      uVar13 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(strm,"              Pprf(",0x13);
        uVar13 = uVar13 + 1;
        poVar6 = (ostream *)std::ostream::operator<<(strm,(int)uVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"): ",3);
        lVar3 = *(long *)poVar6;
        lVar4 = *(long *)(lVar3 + -0x18);
        *(uint *)(poVar6 + lVar4 + 0x18) = *(uint *)(poVar6 + lVar4 + 0x18) & 0xffffffb5 | 8;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) | 0x200;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        lVar3 = *(long *)poVar6;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) & 0xfffffdff;
        std::ios::widen((char)*(undefined8 *)(lVar3 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      } while (uVar13 < (PDesc->Profile).N);
    }
  }
  if ((PDesc->CorrespondingProfile).N != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(strm,"Corresponding Profile:",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    if ((PDesc->CorrespondingProfile).N != 0) {
      uVar13 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(strm,"              Pcpf(",0x13);
        uVar13 = uVar13 + 1;
        poVar6 = (ostream *)std::ostream::operator<<(strm,(int)uVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"): ",3);
        lVar3 = *(long *)poVar6;
        lVar4 = *(long *)(lVar3 + -0x18);
        *(uint *)(poVar6 + lVar4 + 0x18) = *(uint *)(poVar6 + lVar4 + 0x18) & 0xffffffb5 | 8;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) | 0x200;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        lVar3 = *(long *)poVar6;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) & 0xfffffdff;
        std::ios::widen((char)*(undefined8 *)(lVar3 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      } while (uVar13 < (PDesc->CorrespondingProfile).N);
    }
  }
  if (((PDesc->ExtendedCapabilities).N != -1) && ((PDesc->ExtendedCapabilities).Pcap != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(strm,"Extended Capabilities:",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(strm,"                     Pcap:",0x1a);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)strm);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar10 = 0x20;
    uVar12 = 0;
    do {
      if (((PDesc->ExtendedCapabilities).Pcap >> (uVar12 & 0x1f) & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(strm,"              Ccap(",0x13);
        poVar6 = (ostream *)std::ostream::operator<<(strm,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"): ",3);
        lVar3 = *(long *)poVar6;
        lVar4 = *(long *)(lVar3 + -0x18);
        *(uint *)(poVar6 + lVar4 + 0x18) = *(uint *)(poVar6 + lVar4 + 0x18) & 0xffffffb5 | 8;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) | 0x200;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        lVar3 = *(long *)poVar6;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
        *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x18) & 0xfffffdff;
        std::ios::widen((char)*(undefined8 *)(lVar3 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      uVar12 = uVar12 + 1;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  return strm;
}

Assistant:

std::ostream&
ASDCP::JP2K::operator << (std::ostream& strm, const PictureDescriptor& PDesc)
{
  strm << "       AspectRatio: " << PDesc.AspectRatio.Numerator << "/" << PDesc.AspectRatio.Denominator << std::endl;
  strm << "          EditRate: " << PDesc.EditRate.Numerator << "/" << PDesc.EditRate.Denominator << std::endl;
  strm << "        SampleRate: " << PDesc.SampleRate.Numerator << "/" << PDesc.SampleRate.Denominator << std::endl;
  strm << "       StoredWidth: " << (unsigned) PDesc.StoredWidth << std::endl;
  strm << "      StoredHeight: " << (unsigned) PDesc.StoredHeight << std::endl;
  strm << "             Rsize: " << (unsigned) PDesc.Rsize << std::endl;
  strm << "             Xsize: " << (unsigned) PDesc.Xsize << std::endl;
  strm << "             Ysize: " << (unsigned) PDesc.Ysize << std::endl;
  strm << "            XOsize: " << (unsigned) PDesc.XOsize << std::endl;
  strm << "            YOsize: " << (unsigned) PDesc.YOsize << std::endl;
  strm << "            XTsize: " << (unsigned) PDesc.XTsize << std::endl;
  strm << "            YTsize: " << (unsigned) PDesc.YTsize << std::endl;
  strm << "           XTOsize: " << (unsigned) PDesc.XTOsize << std::endl;
  strm << "           YTOsize: " << (unsigned) PDesc.YTOsize << std::endl;
  strm << " ContainerDuration: " << (unsigned) PDesc.ContainerDuration << std::endl;

  strm << "-- JPEG 2000 Metadata --" << std::endl;
  strm << "    ImageComponents:" << std::endl;
  strm << "  bits  h-sep v-sep" << std::endl;

  ui32_t i;
  for ( i = 0; i < PDesc.Csize && i < MaxComponents; ++i )
    {
      strm << "  " << std::setw(4) << PDesc.ImageComponents[i].Ssize + 1 /* See ISO 15444-1, Table A11, for the origin of '+1' */
	   << "  " << std::setw(5) << PDesc.ImageComponents[i].XRsize
	   << " " << std::setw(5) << PDesc.ImageComponents[i].YRsize
	   << std::endl;
    }

  strm << "               Scod: " << (short) PDesc.CodingStyleDefault.Scod << std::endl;
  strm << "   ProgressionOrder: " << (short) PDesc.CodingStyleDefault.SGcod.ProgressionOrder << std::endl;
  strm << "     NumberOfLayers: " << (short) KM_i16_BE(Kumu::cp2i<ui16_t>(PDesc.CodingStyleDefault.SGcod.NumberOfLayers)) << std::endl;
  strm << " MultiCompTransform: " << (short) PDesc.CodingStyleDefault.SGcod.MultiCompTransform << std::endl;
  strm << "DecompositionLevels: " << (short) PDesc.CodingStyleDefault.SPcod.DecompositionLevels << std::endl;
  strm << "     CodeblockWidth: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockWidth << std::endl;
  strm << "    CodeblockHeight: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockHeight << std::endl;
  strm << "     CodeblockStyle: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockStyle << std::endl;
  strm << "     Transformation: " << (short) PDesc.CodingStyleDefault.SPcod.Transformation << std::endl;


  ui32_t precinct_set_size = 0;

  for ( i = 0; PDesc.CodingStyleDefault.SPcod.PrecinctSize[i] != 0 && i < MaxPrecincts; ++i )
    precinct_set_size++;

  strm << "          Precincts: " << (short) precinct_set_size << std::endl;
  strm << "precinct dimensions:" << std::endl;

  for ( i = 0; i < precinct_set_size && i < MaxPrecincts; ++i )
    strm << "    " << i + 1 << ": " << s_exp_lookup[PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]&0x0f] << " x "
	 << s_exp_lookup[(PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]>>4)&0x0f] << std::endl;

  strm << "               Sqcd: " << (short) PDesc.QuantizationDefault.Sqcd << std::endl;

  char tmp_buf[MaxDefaults*2];
  strm << "              SPqcd: " << Kumu::bin2hex(PDesc.QuantizationDefault.SPqcd, PDesc.QuantizationDefault.SPqcdLength, tmp_buf, MaxDefaults*2)
       << std::endl;

  if (PDesc.Profile.N != 0) {
	  strm << "Profile:" << std::endl;

	  for (ui16_t i = 0; i < PDesc.Profile.N; i++) {
		  strm << "              Pprf(" << (i + 1) << "): "
			  << std::hex << std::showbase << PDesc.Profile.Pprf[i] << std::dec << std::noshowbase
			  << std::endl;
	  }
  }

  if (PDesc.CorrespondingProfile.N != 0) {
	  strm << "Corresponding Profile:" << std::endl;

	  for (ui16_t i = 0; i < PDesc.CorrespondingProfile.N; i++) {

		  strm << "              Pcpf(" << (i + 1) << "): "
			  << std::hex << std::showbase <<  PDesc.CorrespondingProfile.Pcpf[i] << std::dec << std::noshowbase
			  << std::endl;
	  }
  }

  if (PDesc.ExtendedCapabilities.N != JP2K::NoExtendedCapabilitiesSignaled && PDesc.ExtendedCapabilities.Pcap != 0) {

	  strm << "Extended Capabilities:" << std::endl;


	  strm << "                     Pcap:" << PDesc.ExtendedCapabilities.Pcap << std::endl;

	  for (i32_t b = 0, i = 0; b < JP2K::MaxCapabilities; b++) {

		  if ((PDesc.ExtendedCapabilities.Pcap >> b) & 0x1) {

			  strm << "              Ccap(" << (JP2K::MaxCapabilities - b) << "): " <<
				  std::hex << std::showbase << PDesc.ExtendedCapabilities.Ccap[i++] << std::dec << std::noshowbase
				  << std::endl;

		  }
	  }
  }

  return strm;
}